

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O1

void __thiscall flow::lang::IRGenerator::codegenInline(IRGenerator *this,HandlerSym *handlerSym)

{
  Report *pRVar1;
  pointer pcVar2;
  SymbolTable *pSVar3;
  pointer puVar4;
  __uniq_ptr_data<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>,_true,_true> _Var5;
  Stmt *pSVar6;
  unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_> *symbol;
  pointer puVar7;
  _Deque_iterator<flow::lang::HandlerSym_*,_flow::lang::HandlerSym_*&,_flow::lang::HandlerSym_**> i;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  HandlerSym *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70 [2];
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  local_d8._M_dataplus._M_p =
       (pointer)(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_d8._M_string_length._0_4_ =
       *(undefined4 *)
        &(this->handlerStack_).
         super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_first;
  local_d8._M_string_length._4_4_ =
       *(undefined4 *)
        ((long)&(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_first + 4);
  local_d8.field_2._M_allocated_capacity._0_4_ =
       *(undefined4 *)
        &(this->handlerStack_).
         super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_last;
  local_d8.field_2._M_allocated_capacity._4_4_ =
       *(undefined4 *)
        ((long)&(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_last + 4);
  local_d8.field_2._8_4_ =
       *(undefined4 *)
        &(this->handlerStack_).
         super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>.
         _M_impl.super__Deque_impl_data._M_start._M_node;
  local_d8.field_2._12_4_ =
       *(undefined4 *)
        ((long)&(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node + 4);
  local_50 = *(undefined4 *)
              &(this->handlerStack_).
               super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  uStack_4c = *(undefined4 *)
               ((long)&(this->handlerStack_).
                       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur + 4);
  uStack_48 = *(undefined4 *)
               &(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first;
  uStack_44 = *(undefined4 *)
               ((long)&(this->handlerStack_).
                       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_first + 4);
  local_40 = *(undefined4 *)
              &(this->handlerStack_).
               super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_last;
  uStack_3c = *(undefined4 *)
               ((long)&(this->handlerStack_).
                       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_last + 4);
  uStack_38 = *(undefined4 *)
               &(this->handlerStack_).
                super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
  uStack_34 = *(undefined4 *)
               ((long)&(this->handlerStack_).
                       super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node + 4);
  local_78 = handlerSym;
  std::
  __find_if<std::_Deque_iterator<flow::lang::HandlerSym*,flow::lang::HandlerSym*&,flow::lang::HandlerSym**>,__gnu_cxx::__ops::_Iter_equals_val<flow::lang::HandlerSym*const>>
            (local_70);
  if ((_Elt_pointer)local_70[0]._0_8_ ==
      (this->handlerStack_).
      super__Deque_base<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>._M_impl
      .super__Deque_impl_data._M_finish._M_cur) {
    local_d8._M_dataplus._M_p = (pointer)handlerSym;
    std::deque<flow::lang::HandlerSym*,std::allocator<flow::lang::HandlerSym*>>::
    emplace_back<flow::lang::HandlerSym*>
              ((deque<flow::lang::HandlerSym*,std::allocator<flow::lang::HandlerSym*>> *)
               &this->handlerStack_,(HandlerSym **)&local_d8);
    pSVar3 = (handlerSym->scope_)._M_t.
             super___uniq_ptr_impl<flow::lang::SymbolTable,_std::default_delete<flow::lang::SymbolTable>_>
             ._M_t.
             super__Tuple_impl<0UL,_flow::lang::SymbolTable_*,_std::default_delete<flow::lang::SymbolTable>_>
             .super__Head_base<0UL,_flow::lang::SymbolTable_*,_false>._M_head_impl;
    if (pSVar3 != (SymbolTable *)0x0) {
      puVar4 = *(pointer *)
                ((long)&(pSVar3->symbols_).
                        super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
                + 8);
      for (puVar7 = *(pointer *)
                     &(pSVar3->symbols_).
                      super__Vector_base<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>,_std::allocator<std::unique_ptr<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>_>_>
          ; puVar7 != puVar4; puVar7 = puVar7 + 1) {
        _Var5.super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>.
        _M_t.super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>.
        super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl =
             (puVar7->_M_t).
             super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>;
        (**(code **)(*(long *)_Var5.
                              super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>
                              .super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl +
                    0x10))(_Var5.
                           super___uniq_ptr_impl<flow::lang::Symbol,_std::default_delete<flow::lang::Symbol>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_flow::lang::Symbol_*,_std::default_delete<flow::lang::Symbol>_>
                           .super__Head_base<0UL,_flow::lang::Symbol_*,_false>._M_head_impl,this);
      }
    }
    if ((handlerSym->body_)._M_t.
        super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
        super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
        super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl == (Stmt *)0x0) {
      pRVar1 = this->report_;
      local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d8,"Forward declared handler \'{}\' is missing implementation.",""
                );
      pcVar2 = (handlerSym->super_CallableSym).super_Symbol.name_._M_dataplus._M_p;
      local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b8,pcVar2,
                 pcVar2 + (handlerSym->super_CallableSym).super_Symbol.name_._M_string_length);
      diagnostics::Report::typeError<std::__cxx11::string>
                (pRVar1,&(handlerSym->super_CallableSym).super_Symbol.super_ASTNode.location_,
                 &local_d8,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._0_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p,
                        CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                                 local_d8.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    pSVar6 = (handlerSym->body_)._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    if (pSVar6 == (Stmt *)0x0) {
      this->result_ = (Value *)0x0;
    }
    else {
      (**(code **)((long)(pSVar6->super_ASTNode)._vptr_ASTNode + 0x10))(pSVar6,this);
    }
    std::deque<flow::lang::HandlerSym_*,_std::allocator<flow::lang::HandlerSym_*>_>::pop_back
              (&this->handlerStack_);
  }
  else {
    pRVar1 = this->report_;
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"Cannot recursively call handler {}.","");
    pcVar2 = (handlerSym->super_CallableSym).super_Symbol.name_._M_dataplus._M_p;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,pcVar2,
               pcVar2 + (handlerSym->super_CallableSym).super_Symbol.name_._M_string_length);
    diagnostics::Report::typeError<std::__cxx11::string>
              (pRVar1,&(handlerSym->super_CallableSym).super_Symbol.super_ASTNode.location_,
               &local_d8,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT44(local_d8.field_2._M_allocated_capacity._4_4_,
                               local_d8.field_2._M_allocated_capacity._0_4_) + 1);
    }
  }
  return;
}

Assistant:

void IRGenerator::codegenInline(HandlerSym& handlerSym) {
  auto i = std::find(handlerStack_.begin(), handlerStack_.end(), &handlerSym);
  if (i != handlerStack_.end()) {
    report_->typeError(handlerSym.location(),
                       "Cannot recursively call handler {}.", handlerSym.name());

    return;
  }

  handlerStack_.push_back(&handlerSym);

  // emit local variable declarations
  if (handlerSym.scope()) {
    for (std::unique_ptr<Symbol>& symbol : *handlerSym.scope()) {
      codegen(symbol.get());
    }
  }

  if (handlerSym.body() == nullptr) {
    report_->typeError(handlerSym.location(),
                       "Forward declared handler '{}' is missing implementation.",
                       handlerSym.name());
  }

  // emit body
  codegen(handlerSym.body());

  handlerStack_.pop_back();
}